

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O2

ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL> *
soul::AST::CommaSeparatedList::getAsExpressionList
          (ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>
           *__return_storage_ptr__,pool_ptr<soul::AST::Expression> *expressionOrList)

{
  CommaSeparatedList *pCVar1;
  pool_ptr<soul::AST::CommaSeparatedList> csl;
  pool_ptr<soul::AST::CommaSeparatedList> local_28;
  pool_ptr<soul::AST::Expression> local_20;
  
  local_20 = (pool_ptr<soul::AST::Expression>)expressionOrList->object;
  cast<soul::AST::CommaSeparatedList,soul::AST::Expression>((soul *)&local_28,&local_20);
  if (local_28.object == (CommaSeparatedList *)0x0) {
    __return_storage_ptr__->items = (pool_ref<soul::AST::Expression> *)__return_storage_ptr__->space
    ;
    __return_storage_ptr__->numActive = 0;
    __return_storage_ptr__->numAllocated = 4;
    if (expressionOrList->object != (Expression *)0x0) {
      local_28.object =
           (CommaSeparatedList *)pool_ptr<soul::AST::Expression>::operator*(expressionOrList);
      ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>::push_back
                (__return_storage_ptr__,(pool_ref<soul::AST::Expression> *)&local_28);
    }
  }
  else {
    pCVar1 = pool_ptr<soul::AST::CommaSeparatedList>::operator->(&local_28);
    ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>::ArrayWithPreallocation
              (__return_storage_ptr__,&pCVar1->items);
  }
  return __return_storage_ptr__;
}

Assistant:

static auto getAsExpressionList (pool_ptr<Expression> expressionOrList)
        {
            if (auto csl = cast<CommaSeparatedList> (expressionOrList))
                return csl->items;

            decltype(CommaSeparatedList::items) list;

            if (expressionOrList != nullptr)
                list.push_back (*expressionOrList);

            return list;
        }